

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int nifti_image_load(nifti_image *nim)

{
  void *pvVar1;
  znzFile local_30;
  znzFile fp;
  size_t ii;
  size_t ntot;
  nifti_image *nim_local;
  
  ntot = (size_t)nim;
  local_30 = nifti_image_load_prep(nim);
  if (local_30 == (znzFile)0x0) {
    if (0 < g_opts.debug) {
      fprintf(_stderr,"** nifti_image_load, failed load_prep\n");
    }
    nim_local._4_4_ = -1;
  }
  else {
    ii = nifti_get_volsize((nifti_image *)ntot);
    if (*(long *)(ntot + 0x298) == 0) {
      pvVar1 = calloc(1,ii);
      *(void **)(ntot + 0x298) = pvVar1;
      if (*(long *)(ntot + 0x298) == 0) {
        if (0 < g_opts.debug) {
          fprintf(_stderr,"** failed to alloc %d bytes for image data\n",ii & 0xffffffff);
        }
        Xznzclose(&local_30);
        return -1;
      }
    }
    fp = (znzFile)nifti_read_buffer(local_30,*(void **)(ntot + 0x298),ii,(nifti_image *)ntot);
    if (fp < ii) {
      Xznzclose(&local_30);
      free(*(void **)(ntot + 0x298));
      *(undefined8 *)(ntot + 0x298) = 0;
      nim_local._4_4_ = -1;
    }
    else {
      Xznzclose(&local_30);
      nim_local._4_4_ = 0;
    }
  }
  return nim_local._4_4_;
}

Assistant:

int nifti_image_load( nifti_image *nim )
{
   /* set up data space, open data file and seek, then call nifti_read_buffer */
   size_t ntot , ii ;
   znzFile fp ;

   /**- open the file and position the FILE pointer */
   fp = nifti_image_load_prep( nim );

   if( fp == NULL ){
      if( g_opts.debug > 0 )
         fprintf(stderr,"** nifti_image_load, failed load_prep\n");
      return -1;
   }

   ntot = nifti_get_volsize(nim);

   /**- if the data pointer is not yet set, get memory space for the image */

   if( nim->data == NULL )
   {
     nim->data = (void *)calloc(1,ntot) ;  /* create image memory */
     if( nim->data == NULL ){
        if( g_opts.debug > 0 )
           fprintf(stderr,"** failed to alloc %d bytes for image data\n",
                   (int)ntot);
        znzclose(fp);
        return -1;
     }
   }

   /**- now that everything is set up, do the reading */
   ii = nifti_read_buffer(fp,nim->data,ntot,nim);
   if( ii < ntot ){
      znzclose(fp) ;
      free(nim->data) ;
      nim->data = NULL ;
      return -1 ;  /* errors were printed in nifti_read_buffer() */
   }

   /**- close the file */
   znzclose( fp ) ;

   return 0 ;
}